

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpxWrapper.cpp
# Opt level: O1

HighsStatus reportIpxIpmCrossoverStatus(HighsOptions *options,Int status,bool ipm_status)

{
  size_t __n;
  int iVar1;
  char *pcVar2;
  undefined7 in_register_00000011;
  HighsStatus HVar3;
  string method_name;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_38 = 0;
  local_30[0] = 0;
  pcVar2 = "Crossover";
  if ((int)CONCAT71(in_register_00000011,ipm_status) != 0) {
    pcVar2 = "IPM      ";
  }
  local_40 = local_30;
  std::__cxx11::string::_M_replace((ulong)&local_40,0,(char *)0x0,(ulong)pcVar2);
  switch(status) {
  case 0:
    pcVar2 = "Ipx: %s not run\n";
    if (!ipm_status) {
      __n = (options->super_HighsOptionsStruct).run_crossover._M_string_length;
      HVar3 = kOk;
      if ((__n != kHighsOnString_abi_cxx11_._M_string_length) ||
         ((__n != 0 &&
          (iVar1 = bcmp((options->super_HighsOptionsStruct).run_crossover._M_dataplus._M_p,
                        kHighsOnString_abi_cxx11_._M_dataplus._M_p,__n), iVar1 != 0))))
      goto LAB_00205cad;
    }
    break;
  case 1:
    pcVar2 = "Ipx: %s optimal\n";
    goto LAB_00205c2b;
  case 2:
    pcVar2 = "Ipx: %s imprecise\n";
    break;
  case 3:
    pcVar2 = "Ipx: %s primal infeasible\n";
    break;
  case 4:
    pcVar2 = "Ipx: %s dual infeasible\n";
    break;
  case 5:
    pcVar2 = "Ipx: %s user interrupt\n";
    status = kWarning;
LAB_00205c2b:
    HVar3 = kOk;
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,status,pcVar2,local_40);
    goto LAB_00205cad;
  case 6:
    pcVar2 = "Ipx: %s reached time limit\n";
    break;
  case 7:
    pcVar2 = "Ipx: %s reached iteration limit\n";
    break;
  case 8:
    pcVar2 = "Ipx: %s no progress\n";
    break;
  case 9:
    pcVar2 = "Ipx: %s failed\n";
    goto LAB_00205c8d;
  case 10:
    pcVar2 = "Ipx: %s debug\n";
    goto LAB_00205c8d;
  default:
    pcVar2 = "Ipx: %s unrecognised status\n";
LAB_00205c8d:
    HVar3 = kError;
    highsLogUser(&(options->super_HighsOptionsStruct).log_options,kError,pcVar2,local_40);
    goto LAB_00205cad;
  }
  HVar3 = kWarning;
  highsLogUser(&(options->super_HighsOptionsStruct).log_options,kWarning,pcVar2,local_40);
LAB_00205cad:
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return HVar3;
}

Assistant:

HighsStatus reportIpxIpmCrossoverStatus(const HighsOptions& options,
                                        const ipx::Int status,
                                        const bool ipm_status) {
  std::string method_name;
  if (ipm_status)
    method_name = "IPM      ";
  else
    method_name = "Crossover";
  if (status == IPX_STATUS_not_run) {
    if (ipm_status || options.run_crossover == kHighsOnString) {
      // Warn if method not run is IPM or method not run is crossover
      // and run_crossover option is "on"
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "Ipx: %s not run\n", method_name.c_str());
      return HighsStatus::kWarning;
    }
    // OK if method not run is crossover and run_crossover option is
    // not "on"
    return HighsStatus::kOk;
  } else if (status == IPX_STATUS_optimal) {
    highsLogUser(options.log_options, HighsLogType::kInfo, "Ipx: %s optimal\n",
                 method_name.c_str());
    return HighsStatus::kOk;
  } else if (status == IPX_STATUS_imprecise) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s imprecise\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_primal_infeas) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s primal infeasible\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_dual_infeas) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s dual infeasible\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_user_interrupt) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s user interrupt\n", method_name.c_str());
    return HighsStatus::kOk;
  } else if (status == IPX_STATUS_time_limit) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s reached time limit\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_iter_limit) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s reached iteration limit\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_no_progress) {
    highsLogUser(options.log_options, HighsLogType::kWarning,
                 "Ipx: %s no progress\n", method_name.c_str());
    return HighsStatus::kWarning;
  } else if (status == IPX_STATUS_failed) {
    highsLogUser(options.log_options, HighsLogType::kError, "Ipx: %s failed\n",
                 method_name.c_str());
    return HighsStatus::kError;
  } else if (status == IPX_STATUS_debug) {
    highsLogUser(options.log_options, HighsLogType::kError, "Ipx: %s debug\n",
                 method_name.c_str());
    return HighsStatus::kError;
  } else {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "Ipx: %s unrecognised status\n", method_name.c_str());
    return HighsStatus::kError;
  }
  return HighsStatus::kError;
}